

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O2

void __thiscall
QEvdevKeyboardManager::QEvdevKeyboardManager
          (QEvdevKeyboardManager *this,QString *key,QString *specification,QObject *parent)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  QLoggingCategory *pQVar4;
  QDeviceDiscovery *signal;
  QString *device;
  QString *pQVar5;
  QString *device_1;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined1 local_c0 [12];
  undefined4 uStack_b4;
  QFlagsStorage<QDeviceDiscovery::QDeviceType> QStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  ParsedSpecification local_98;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_00111600;
  (this->m_spec).d.d = (Data *)0x0;
  (this->m_spec).d.ptr = (char16_t *)0x0;
  (this->m_spec).d.size = 0;
  (this->m_keyboards).v.
  super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_keyboards).v.
  super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_keyboards).v.
  super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_defaultKeymapFile).d.d = (Data *)0x0;
  (this->m_defaultKeymapFile).d.ptr = (char16_t *)0x0;
  (this->m_defaultKeymapFile).d.size = 0;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)&local_48);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
    QString::operator=((QString *)&local_48,specification);
  }
  local_98.args.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.args.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.args.d.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.devices.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.devices.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.spec.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.devices.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.spec.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.spec.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QEvdevUtil::parseSpecification(&local_98,(QString *)&local_48);
  pDVar2 = (this->m_spec).d.d;
  pcVar3 = (this->m_spec).d.ptr;
  (this->m_spec).d.d = local_98.spec.d.d;
  (this->m_spec).d.ptr = local_98.spec.d.ptr;
  qVar1 = (this->m_spec).d.size;
  (this->m_spec).d.size = local_98.spec.d.size;
  pQVar5 = local_98.devices.d.ptr;
  local_98.spec.d.d = pDVar2;
  local_98.spec.d.ptr = pcVar3;
  local_98.spec.d.size = qVar1;
  for (lVar6 = local_98.devices.d.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
    addKeyboard(this,pQVar5);
    pQVar5 = pQVar5 + 1;
  }
  if ((undefined1 *)local_98.devices.d.size == (undefined1 *)0x0) {
    pQVar4 = QtPrivateLogging::qLcEvdevKey();
    if (((pQVar4->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_a0 = pQVar4->name;
      local_c0._8_4_ = 2;
      uStack_b4 = 0;
      QStack_b0.i = 0;
      uStack_ac = 0;
      uStack_a8 = 0;
      uStack_a4 = 0;
      QMessageLogger::debug(local_c0 + 8,"evdevkeyboard: Using device discovery");
    }
    signal = QDeviceDiscovery::create((QDeviceTypes)0x8,&this->super_QObject);
    if (signal != (QDeviceDiscovery *)0x0) {
      uStack_a8 = 0xaaaaaaaa;
      uStack_a4 = 0xaaaaaaaa;
      local_c0._8_4_ = 0xaaaaaaaa;
      uStack_b4 = 0xaaaaaaaa;
      QStack_b0.i = 0xaaaaaaaa;
      uStack_ac = 0xaaaaaaaa;
      (**(code **)(*(long *)signal + 0x60))(local_c0 + 8,signal);
      pQVar5 = (QString *)CONCAT44(uStack_ac,QStack_b0.i);
      for (lVar6 = CONCAT44(uStack_a4,uStack_a8) * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
        addKeyboard(this,pQVar5);
        pQVar5 = pQVar5 + 1;
      }
      local_d8._8_8_ = addKeyboard;
      local_c8._0_4_ = (QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4>)0x0;
      local_c8._4_4_ = 0;
      QObject::
      connect<void(QDeviceDiscovery::*)(QString_const&),void(QEvdevKeyboardManager::*)(QString_const&)>
                ((Object *)local_c0,(offset_in_QDeviceDiscovery_to_subr)signal,
                 (ContextType *)QDeviceDiscovery::deviceDetected,
                 (offset_in_QEvdevKeyboardManager_to_subr *)0x0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_c0);
      local_d8._8_8_ = removeKeyboard;
      local_c8._0_4_ = (QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4>)0x0;
      local_c8._4_4_ = 0;
      QObject::
      connect<void(QDeviceDiscovery::*)(QString_const&),void(QEvdevKeyboardManager::*)(QString_const&)>
                ((Object *)local_d8,(offset_in_QDeviceDiscovery_to_subr)signal,
                 (ContextType *)QDeviceDiscovery::deviceRemoved,
                 (offset_in_QEvdevKeyboardManager_to_subr *)0x0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_d8);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_c0 + 8));
    }
  }
  QEvdevUtil::ParsedSpecification::~ParsedSpecification(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEvdevKeyboardManager::QEvdevKeyboardManager(const QString &key, const QString &specification, QObject *parent)
    : QObject(parent)
{
    Q_UNUSED(key);


    QString spec = qEnvironmentVariable("QT_QPA_EVDEV_KEYBOARD_PARAMETERS");

    if (spec.isEmpty())
        spec = specification;

    auto parsed = QEvdevUtil::parseSpecification(spec);
    m_spec = std::move(parsed.spec);

    // add all keyboards for devices specified in the argument list
    for (const QString &device : std::as_const(parsed.devices))
        addKeyboard(device);

    if (parsed.devices.isEmpty()) {
        qCDebug(qLcEvdevKey, "evdevkeyboard: Using device discovery");
        if (auto deviceDiscovery = QDeviceDiscovery::create(QDeviceDiscovery::Device_Keyboard, this)) {
            // scan and add already connected keyboards
            const QStringList devices = deviceDiscovery->scanConnectedDevices();
            for (const QString &device : devices)
                addKeyboard(device);

            connect(deviceDiscovery, &QDeviceDiscovery::deviceDetected,
                    this, &QEvdevKeyboardManager::addKeyboard);
            connect(deviceDiscovery, &QDeviceDiscovery::deviceRemoved,
                    this, &QEvdevKeyboardManager::removeKeyboard);
        }
    }
}